

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

string * __thiscall
SchemeCompoundProcedure::external_repr_abi_cxx11_
          (string *__return_storage_ptr__,SchemeCompoundProcedure *this)

{
  ulong uVar1;
  bool bVar2;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SchemeCompoundProcedure *local_18;
  SchemeCompoundProcedure *this_local;
  
  local_18 = this;
  this_local = (SchemeCompoundProcedure *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"",&local_59);
  }
  else {
    std::operator+(&local_58," ",&(this->super_SchemeProcedure).name);
  }
  std::operator+(&local_38,"<compound-procedure",&local_58);
  std::operator+(__return_storage_ptr__,&local_38,">");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeCompoundProcedure::external_repr() const
{
    return "<compound-procedure" + (name.empty() ? "" : (" " + name)) + ">";
}